

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

pointer __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::iterator::operator->(iterator *this)

{
  ctrl_t *pcVar1;
  code *pcVar2;
  anon_union_8_1_a8a14541_for_iterator_2 aVar3;
  reference ppVar4;
  pointer extraout_RAX;
  char **value;
  long *in_RSI;
  
  pcVar2 = (code *)this->ctrl_;
  if (pcVar2 == (code *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::iterator::operator->((iterator *)this);
  }
  else if (pcVar2 != google::protobuf::internal::TypeCardToString_abi_cxx11_) {
    if (-1 < (char)*pcVar2) {
      ppVar4 = operator*(this);
      return ppVar4;
    }
    goto LAB_002d3abc;
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::iterator::operator->((iterator *)this);
LAB_002d3abc:
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::iterator::operator->((iterator *)this);
  this->ctrl_ = (ctrl_t *)(this + 1);
  pcVar1 = (ctrl_t *)(in_RSI + 2);
  if ((ctrl_t *)*in_RSI == pcVar1) {
    aVar3 = *(anon_union_8_1_a8a14541_for_iterator_2 *)(in_RSI + 3);
    this[1].ctrl_ = *(ctrl_t **)pcVar1;
    this[1].field_1 = aVar3;
  }
  else {
    this->ctrl_ = (ctrl_t *)*in_RSI;
    this[1].ctrl_ = *(ctrl_t **)pcVar1;
  }
  this->field_1 = *(anon_union_8_1_a8a14541_for_iterator_2 *)(in_RSI + 1);
  *in_RSI = (long)pcVar1;
  in_RSI[1] = 0;
  *(undefined1 *)(in_RSI + 2) = 0;
  google::protobuf::io::Printer::ValueImpl<true>::ValueImpl<char_const*const&,void>
            ((ValueImpl<true> *)(this + 2),value);
  *(undefined1 *)&this[0xb].ctrl_ = 0;
  return extraout_RAX;
}

Assistant:

pointer operator->() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator->");
      return &operator*();
    }